

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O0

int Extra_Base2LogDouble(double Num)

{
  double dVar1;
  double dVar2;
  int ResInt;
  double Res;
  double Num_local;
  
  dVar1 = log(Num);
  dVar2 = log(2.0);
  dVar1 = dVar1 / dVar2;
  Num_local._4_4_ = (int)dVar1;
  if (((double)Num_local._4_4_ != dVar1) || (NAN((double)Num_local._4_4_) || NAN(dVar1))) {
    Num_local._4_4_ = Num_local._4_4_ + 1;
  }
  return Num_local._4_4_;
}

Assistant:

int Extra_Base2LogDouble( double Num )
{
    double Res;
    int ResInt;

    Res    = log(Num)/log(2.0);
    ResInt = (int)Res;
    if ( ResInt == Res )
        return ResInt;
    else 
        return ResInt+1;
}